

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

int rtr_mgr_setup_sockets
              (rtr_mgr_config *config,rtr_mgr_group *groups,uint groups_len,uint refresh_interval,
              uint expire_interval,uint retry_interval)

{
  long lVar1;
  int iVar2;
  tommy_list_wrapper *ptVar3;
  tommy_node_struct *group;
  tommy_node *node;
  rtr_mgr_group *prVar4;
  long in_FS_OFFSET;
  uint local_54;
  uint i;
  rtr_mgr_group *cg;
  rtr_mgr_group_node *group_node;
  rtr_interval_mode iv_mode;
  uint retry_interval_local;
  uint expire_interval_local;
  uint refresh_interval_local;
  uint groups_len_local;
  rtr_mgr_group *groups_local;
  rtr_mgr_config *config_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  config->len = groups_len;
  ptVar3 = (tommy_list_wrapper *)lrtr_malloc(8);
  config->groups = ptVar3;
  if (config->groups == (tommy_list_wrapper *)0x0) {
    config_local._4_4_ = -1;
  }
  else {
    config->groups->list = (tommy_list)0x0;
    for (local_54 = 0; local_54 < groups_len; local_54 = local_54 + 1) {
      group = (tommy_node_struct *)lrtr_malloc(0x18);
      if (group == (tommy_node_struct *)0x0) {
        config_local._4_4_ = -1;
        goto LAB_001039fc;
      }
      prVar4 = groups + local_54;
      group->next = (tommy_node_struct *)prVar4->sockets;
      group->prev = *(tommy_node_struct **)&prVar4->sockets_len;
      group->data = *(void **)&prVar4->status;
      *(rtr_mgr_status *)&group->data = RTR_MGR_CLOSED;
      iVar2 = rtr_mgr_init_sockets
                        ((rtr_mgr_group *)group,config,refresh_interval,expire_interval,
                         retry_interval,RTR_INTERVAL_MODE_DEFAULT_MIN_MAX);
      if (iVar2 != 0) {
        lrtr_free(group);
        config_local._4_4_ = -1;
        goto LAB_001039fc;
      }
      node = (tommy_node *)lrtr_malloc(0x28);
      if (node == (tommy_node *)0x0) {
        lrtr_free(group);
        config_local._4_4_ = -1;
        goto LAB_001039fc;
      }
      node[1].next = group;
      tommy_list_insert_tail(&config->groups->list,node,node);
    }
    tommy_list_sort(&config->groups->list,rtr_mgr_config_cmp_tommy);
    config_local._4_4_ = 0;
  }
LAB_001039fc:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return config_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_setup_sockets(struct rtr_mgr_config *config, struct rtr_mgr_group groups[],
					const unsigned int groups_len, const unsigned int refresh_interval,
					const unsigned int expire_interval, const unsigned int retry_interval)
{
	enum rtr_interval_mode iv_mode = RTR_INTERVAL_MODE_DEFAULT_MIN_MAX;
	struct rtr_mgr_group_node *group_node = NULL;
	struct rtr_mgr_group *cg = NULL;
	/* Copy the groups from the array into linked list config->groups */
	config->len = groups_len;
	config->groups = lrtr_malloc(sizeof(*config->groups));
	if (!config->groups) {
		return RTR_ERROR;
	}

	config->groups->list = NULL;

	for (unsigned int i = 0; i < groups_len; i++) {
		cg = lrtr_malloc(sizeof(struct rtr_mgr_group));
		if (!cg) {
			return RTR_ERROR;
		}

		memcpy(cg, &groups[i], sizeof(struct rtr_mgr_group));

		cg->status = RTR_MGR_CLOSED;
		if (rtr_mgr_init_sockets(cg, config, refresh_interval, expire_interval, retry_interval, iv_mode)) {
			lrtr_free(cg);
			return RTR_ERROR;
		}

		group_node = lrtr_malloc(sizeof(struct rtr_mgr_group_node));
		if (!group_node) {
			lrtr_free(cg);
			return RTR_ERROR;
		}

		group_node->group = cg;
		tommy_list_insert_tail(&config->groups->list, &group_node->node, group_node);
	}
	/* Our linked list should be sorted already, since the groups array was
	 * sorted. However, for safety reasons we sort again.
	 */
	tommy_list_sort(&config->groups->list, &rtr_mgr_config_cmp_tommy);

	return RTR_SUCCESS;
}